

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBegin_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params cctxParams_00;
  ZSTD_parameters params_00;
  ZSTD_CCtx_params params_01;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 unaff_retaddr;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  void *in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  unsigned_long_long in_stack_00000038;
  ZSTD_CCtx_params cctxParams;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  ZSTD_CDict *in_stack_ffffffffffffff80;
  ZSTD_dictTableLoadMethod_e in_stack_ffffffffffffff88;
  ZSTD_dictContentType_e in_stack_ffffffffffffff8c;
  size_t in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  ZSTD_CCtx *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  
  cctxParams_00.customMem.customAlloc = (ZSTD_allocFunction)in_stack_00000008;
  cctxParams_00._0_96_ = *(undefined1 (*) [96])(in_RDI + 0x28);
  cctxParams_00.customMem.customFree = (ZSTD_freeFunction)in_stack_00000010;
  cctxParams_00.customMem.opaque = in_stack_00000018;
  params_00.cParams._8_8_ = in_stack_00000028;
  params_00.cParams._0_8_ = in_stack_00000020;
  params_00.cParams._16_8_ = in_stack_ffffffffffffff68;
  params_00._24_8_ = in_stack_ffffffffffffff70;
  params_00.fParams._4_8_ = in_stack_ffffffffffffff78;
  ZSTD_assignParamsToCCtxParams(cctxParams_00,params_00);
  params_01.cParams.chainLog = (int)in_stack_ffffffffffffffc8;
  params_01.cParams.hashLog = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  params_01.format = (int)in_stack_ffffffffffffffc0;
  params_01.cParams.windowLog = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  params_01.cParams.searchLog = (int)in_stack_ffffffffffffffd0;
  params_01.cParams.searchLength = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  params_01.cParams.targetLength = (int)in_stack_ffffffffffffffd8;
  params_01.cParams.strategy = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  params_01.fParams.contentSizeFlag = (int)in_RCX;
  params_01.fParams.checksumFlag = (int)((ulong)in_RCX >> 0x20);
  params_01.fParams.noDictIDFlag = (int)in_RDX;
  params_01.compressionLevel = (int)((ulong)in_RDX >> 0x20);
  params_01.disableLiteralCompression = (int)in_RSI;
  params_01.forceWindow = (int)((ulong)in_RSI >> 0x20);
  params_01.nbWorkers = (int)in_RDI;
  params_01.jobSize = (int)((ulong)in_RDI >> 0x20);
  params_01.ldmParams._4_8_ = in_stack_00000008;
  params_01._64_8_ = unaff_retaddr;
  params_01.ldmParams._12_8_ = in_stack_00000010;
  params_01._88_8_ = in_stack_00000018;
  params_01.customMem.customAlloc = (ZSTD_allocFunction)in_stack_00000020;
  params_01.customMem.customFree = (ZSTD_freeFunction)in_stack_00000028;
  params_01.customMem.opaque = (void *)in_stack_00000030;
  sVar1 = ZSTD_compressBegin_advanced_internal
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     params_01,in_stack_00000038);
  return sVar1;
}

Assistant:

size_t ZSTD_compressBegin_advanced(ZSTD_CCtx* cctx,
                             const void* dict, size_t dictSize,
                                   ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params const cctxParams =
            ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    return ZSTD_compressBegin_advanced_internal(cctx,
                                            dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                            NULL /*cdict*/,
                                            cctxParams, pledgedSrcSize);
}